

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

int __thiscall filtered_union_find::link(filtered_union_find *this,char *__from,char *__to)

{
  float fVar1;
  float fVar2;
  pointer plVar3;
  long lVar4;
  long lVar5;
  pointer pfVar6;
  int in_EAX;
  long *plVar7;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  pointer pvVar8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  long *plVar9;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first_00;
  pointer pvVar10;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last_00;
  
  plVar3 = (this->parent).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = plVar3[(long)__from];
  lVar5 = plVar3[(long)__to];
  if (lVar4 == lVar5) {
    return in_EAX;
  }
  pfVar6 = (this->filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar1 = pfVar6[lVar4];
  fVar2 = pfVar6[lVar5];
  if (fVar2 <= fVar1) {
    pvVar10 = (this->rank).
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = pvVar10 + lVar4;
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      plVar9 = (pvVar8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __last_00._M_current =
           *(pointer *)
            ((long)&(pvVar8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data + 8);
      __first._M_current = plVar9;
    }
    else {
      plVar9 = (pvVar8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __last_00._M_current =
           *(pointer *)
            ((long)&(pvVar8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data + 8);
      plVar7 = pvVar10[lVar5].super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      __last._M_current =
           *(pointer *)
            ((long)&pvVar10[lVar5].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data + 8);
      __first._M_current = plVar9;
      __first_00._M_current = plVar7;
      if ((ulong)((long)__last._M_current - (long)plVar7) <
          (ulong)((long)__last_00._M_current - (long)plVar9)) goto LAB_0012709f;
    }
    for (; plVar9 != __last_00._M_current; plVar9 = plVar9 + 1) {
      plVar3[*plVar9] = lVar5;
    }
    std::vector<long,std::allocator<long>>::
    insert<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
              ((vector<long,std::allocator<long>> *)(pvVar10 + lVar5),
               (const_iterator)
               *(pointer *)
                ((long)&pvVar10[lVar5].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data + 8),__first,__last_00);
  }
  else {
    pvVar10 = (this->rank).
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    plVar7 = pvVar10[lVar5].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    __last._M_current =
         *(pointer *)
          ((long)&pvVar10[lVar5].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data + 8);
    __first_00._M_current = plVar7;
LAB_0012709f:
    for (; plVar7 != __last._M_current; plVar7 = plVar7 + 1) {
      plVar3[*plVar7] = lVar4;
    }
    std::vector<long,std::allocator<long>>::
    insert<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
              ((vector<long,std::allocator<long>> *)(pvVar10 + lVar4),
               (const_iterator)
               *(pointer *)
                ((long)&pvVar10[lVar4].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data + 8),__first_00,__last);
  }
  return (int)(this->filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
}

Assistant:

value_t link(index_t x, index_t y) {
		x = find(x);
		y = find(y);
		if (x == y) return -1;
		if (filtration[x] < filtration[y] || (filtration[x] == filtration[y] && rank[x].size() > rank[y].size())){
			for(auto i : rank[y]) parent[i] = x;
			rank[x].insert(rank[x].end(),rank[y].begin(),rank[y].end());
			return filtration[y];
		} else {
			for(auto i : rank[x]) parent[i] = y;
			rank[y].insert(rank[y].end(),rank[x].begin(),rank[x].end());
			return filtration[x];
		}
	}